

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fibonacci_heap.cpp
# Opt level: O3

FibHeap fib_heap_union(FibHeap h1,FibHeap h2)

{
  _FibonacciNode *p_Var1;
  _FibonacciNode *p_Var2;
  _FibonacciNode *p_Var3;
  _FibonacciNode *p_Var4;
  int iVar5;
  FibHeap __ptr;
  
  if (h1 == (FibHeap)0x0) {
    return h2;
  }
  if (h2 == (FibHeap)0x0) {
    return h1;
  }
  __ptr = h2;
  if (h1->maxDegree < h2->maxDegree) {
    __ptr = h1;
    h1 = h2;
  }
  p_Var1 = h1->min;
  p_Var2 = __ptr->min;
  if (p_Var1 == (_FibonacciNode *)0x0) {
    h1->min = p_Var2;
    iVar5 = __ptr->keyNum;
  }
  else {
    if (p_Var2 == (_FibonacciNode *)0x0) goto LAB_00102b2e;
    p_Var3 = p_Var1->right;
    p_Var4 = p_Var2->right;
    p_Var1->right = p_Var4;
    p_Var4->left = p_Var1;
    p_Var2->right = p_Var3;
    p_Var3->left = p_Var2;
    if (p_Var2->key < p_Var1->key) {
      h1->min = p_Var2;
    }
    iVar5 = h1->keyNum + __ptr->keyNum;
  }
  h1->keyNum = iVar5;
LAB_00102b2e:
  free(__ptr->cons);
  free(__ptr);
  return h1;
}

Assistant:

FibHeap fib_heap_union(FibHeap h1, FibHeap h2) {
    FibHeap tmp;

    if (h1 == NULL)
        return h2;
    if (h2 == NULL)
        return h1;

    // 以h1为"母"，将h2附加到h1上；下面是保证h1的度数大，尽可能的少操作。
    if (h2->maxDegree > h1->maxDegree) {
        tmp = h1;
        h1 = h2;
        h2 = tmp;
    }

    if ((h1->min) == NULL)                // h1无"最小节点"
    {
        h1->min = h2->min;
        h1->keyNum = h2->keyNum;
        free(h2->cons);
        free(h2);
    } else if ((h2->min) == NULL)           // h1有"最小节点" && h2无"最小节点"
    {
        free(h2->cons);
        free(h2);
    }                                   // h1有"最小节点" && h2有"最小节点"
    else {
        // 将"h2中根链表"添加到"h1"中
        fib_node_cat(h1->min, h2->min);
        if (h1->min->key > h2->min->key)
            h1->min = h2->min;
        h1->keyNum += h2->keyNum;
        free(h2->cons);
        free(h2);
    }

    return h1;
}